

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int main(int argc,char **argv)

{
  aom_noise_model_params_t params_00;
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  aom_codec_err_t aVar5;
  aom_image_t *paVar6;
  ulong uVar7;
  undefined8 *in_RSI;
  aom_internal_error_info error_info;
  aom_film_grain_t grain;
  aom_film_grain_t grain_1;
  int64_t cur_timestamp;
  aom_noise_status_t status;
  int chroma_sub [3];
  int strides [3];
  uint8_t *denoised_planes [3];
  uint8_t *planes [3];
  int num_flat_blocks;
  int frame_count;
  int64_t prev_timestamp;
  aom_film_grain_table_t grain_table;
  FILE *debug_file;
  FILE *denoised_file;
  aom_noise_model_params_t params;
  aom_noise_model_t noise_model;
  int16_t random_seed;
  uint8_t *flat_blocks;
  int num_blocks_h;
  int num_blocks_w;
  aom_flat_block_finder_t block_finder;
  int block_size;
  int high_bd;
  AvxVideoInfo info;
  FILE *infile;
  aom_image_t denoised;
  aom_image_t raw;
  noise_model_args_t args;
  aom_noise_model_t *in_stack_fffffffffffff3d0;
  int in_stack_fffffffffffff3d8;
  undefined4 in_stack_fffffffffffff3dc;
  FILE *in_stack_fffffffffffff3e0;
  aom_noise_model_t *in_stack_fffffffffffff3e8;
  uint in_stack_fffffffffffff3f0;
  uint in_stack_fffffffffffff3f4;
  uint in_stack_fffffffffffff3f8;
  aom_img_fmt_t in_stack_fffffffffffff3fc;
  int in_stack_fffffffffffff400;
  undefined4 in_stack_fffffffffffff404;
  int in_stack_fffffffffffff43c;
  int in_stack_fffffffffffff440;
  int in_stack_fffffffffffff444;
  aom_flat_block_finder_t *in_stack_fffffffffffff448;
  int *in_stack_fffffffffffff468;
  int in_stack_fffffffffffff470;
  int in_stack_fffffffffffff474;
  uint8_t **in_stack_fffffffffffff478;
  uint8_t **in_stack_fffffffffffff480;
  aom_noise_model_t *in_stack_fffffffffffff488;
  int *in_stack_fffffffffffff4d0;
  uint8_t *in_stack_fffffffffffff4d8;
  int in_stack_fffffffffffff4e0;
  uint8_t *in_stack_fffffffffffff528;
  int in_stack_fffffffffffff534;
  int in_stack_fffffffffffff538;
  int in_stack_fffffffffffff53c;
  aom_film_grain_t *in_stack_fffffffffffff540;
  aom_noise_model_t *in_stack_fffffffffffff548;
  aom_noise_model_t *in_stack_fffffffffffff668;
  int in_stack_fffffffffffff674;
  uint8_t *in_stack_fffffffffffff678;
  aom_image_t *in_stack_fffffffffffff680;
  aom_image_t *in_stack_fffffffffffff688;
  FILE *in_stack_fffffffffffff690;
  int local_50c;
  ulong local_508;
  undefined1 local_500 [16];
  FILE *local_4f0;
  FILE *local_4e8;
  undefined1 local_4e0;
  undefined4 uStack_4dc;
  uint local_4d8;
  uint uStack_4d4;
  undefined2 local_20a;
  aom_noise_model_t *local_208;
  int local_200;
  int local_1fc;
  int local_1d0;
  uint local_1cc;
  undefined1 local_1c8 [4];
  uint local_1c4;
  uint local_1c0;
  int local_1bc;
  int local_1b8;
  FILE *local_1b0;
  uint local_a8;
  uint local_58;
  uint local_54;
  int local_50;
  int local_4c;
  char *local_48;
  char *local_40;
  long local_38;
  int local_2c;
  uint local_28;
  int local_24;
  int local_1c;
  char *local_18;
  undefined8 *local_10;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  memcpy(&local_58,&DAT_00b7d708,0x48);
  local_1b0 = (FILE *)0x0;
  memset(local_1c8,0,0x18);
  exec_name = (char *)*local_10;
  parse_args((noise_model_args_t *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
             (char **)CONCAT44(in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8));
  local_1c4 = local_58;
  local_1c0 = local_54;
  local_1bc = local_4c;
  local_1b8 = local_50;
  if (((((int)local_58 < 1) || ((int)local_54 < 1)) || ((int)local_58 % 2 != 0)) ||
     ((int)local_54 % 2 != 0)) {
    die("Invalid frame size: %dx%d",(ulong)local_58,(ulong)local_54);
  }
  paVar6 = aom_img_alloc((aom_image_t *)
                         CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                         in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8,
                         in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0);
  if (paVar6 == (aom_image_t *)0x0) {
    die("Failed to allocate image.");
  }
  paVar6 = aom_img_alloc((aom_image_t *)
                         CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                         in_stack_fffffffffffff3fc,in_stack_fffffffffffff3f8,
                         in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0);
  if (paVar6 == (aom_image_t *)0x0) {
    die("Failed to allocate image.");
  }
  local_1b0 = fopen64(local_48,"rb");
  if (local_1b0 == (FILE *)0x0) {
    die("Failed to open input file: %s",local_48);
  }
  fprintf(_stderr,"Bit depth: %d  stride:%d\n",(ulong)local_28,(ulong)local_a8);
  local_1cc = (uint)(8 < (int)local_28);
  local_1d0 = local_2c;
  aom_flat_block_finder_init
            (in_stack_fffffffffffff448,in_stack_fffffffffffff444,in_stack_fffffffffffff440,
             in_stack_fffffffffffff43c);
  local_1fc = (int)(local_1c4 + local_1d0 + -1) / local_1d0;
  local_200 = (int)(local_1c0 + local_1d0 + -1) / local_1d0;
  local_208 = (aom_noise_model_t *)aom_malloc(0x118dde);
  if (local_208 == (aom_noise_model_t *)0x0) {
    die("Failed to allocate block data.");
  }
  local_20a = 0x1cdf;
  local_4e0 = 1;
  uStack_4dc = 3;
  local_4d8 = local_28;
  uStack_4d4 = local_1cc;
  params_00.lag = in_stack_fffffffffffff3f8;
  params_00._0_4_ = in_stack_fffffffffffff3f4;
  params_00.bit_depth = in_stack_fffffffffffff3fc;
  params_00.use_highbd = in_stack_fffffffffffff400;
  aom_noise_model_init(in_stack_fffffffffffff3e8,params_00);
  local_4e8 = (FILE *)0x0;
  if (local_40 == (char *)0x0) {
    die("--input-denoised file must be specified");
  }
  local_4e8 = fopen64(local_40,"rb");
  if (local_4e8 != (FILE *)0x0) {
    local_4f0 = (FILE *)0x0;
    if (local_18 != (char *)0x0) {
      local_4f0 = fopen64(local_18,"w");
    }
    memset(local_500,0,0x10);
    local_508 = 0;
    local_50c = 0;
    while( true ) {
      _Var1 = aom_img_read((aom_image_t *)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0);
      if (!_Var1) {
        aom_noise_model_get_grain_parameters(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
        aom_film_grain_table_append
                  ((aom_film_grain_table_t *)
                   CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                   (int64_t)in_stack_fffffffffffff3e8,(int64_t)in_stack_fffffffffffff3e0,
                   (aom_film_grain_t *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8)
                  );
        if ((local_38 != 0) &&
           (aVar5 = aom_film_grain_table_write
                              ((aom_film_grain_table_t *)in_stack_fffffffffffff3e8,
                               (char *)in_stack_fffffffffffff3e0,
                               (aom_internal_error_info *)
                               CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8)),
           aVar5 != AOM_CODEC_OK)) {
          die("Unable to write output film grain table");
        }
        aom_film_grain_table_free((aom_film_grain_table_t *)in_stack_fffffffffffff3d0);
        if (local_1b0 != (FILE *)0x0) {
          fclose(local_1b0);
        }
        if (local_4e8 != (FILE *)0x0) {
          fclose(local_4e8);
        }
        if (local_4f0 != (FILE *)0x0) {
          fclose(local_4f0);
        }
        aom_img_free((aom_image_t *)0x1193a9);
        aom_img_free((aom_image_t *)0x1193b6);
        return 0;
      }
      if ((local_40 != (char *)0x0) &&
         (_Var1 = aom_img_read((aom_image_t *)in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e0),
         !_Var1)) break;
      if (local_50c % local_1c == 0) {
        iVar3 = local_1fc * local_200;
        memset(local_208,1,(long)iVar3);
        if (local_24 != 0) {
          memset(local_208,0,(long)iVar3);
          uVar4 = aom_flat_block_finder_run
                            ((aom_flat_block_finder_t *)in_stack_fffffffffffff548,
                             (uint8_t *)in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                             in_stack_fffffffffffff538,in_stack_fffffffffffff534,
                             in_stack_fffffffffffff528);
          fprintf(_stdout,"Num flat blocks %d\n",(ulong)uVar4);
        }
        fprintf(_stdout,"Updating noise model...\n");
        in_stack_fffffffffffff3d0 = local_208;
        in_stack_fffffffffffff3d8 = local_1d0;
        bVar2 = aom_noise_model_update
                          (in_stack_fffffffffffff488,in_stack_fffffffffffff480,
                           in_stack_fffffffffffff478,in_stack_fffffffffffff474,
                           in_stack_fffffffffffff470,in_stack_fffffffffffff468,
                           in_stack_fffffffffffff4d0,in_stack_fffffffffffff4d8,
                           in_stack_fffffffffffff4e0);
        uVar7 = (ulong)((long)local_50c * 10000000 * (long)local_4c) / (ulong)(long)local_50;
        if (bVar2 == 3) {
          fprintf(_stdout,"Noise type is different, updating parameters for time [ %ld, %ld)\n",
                  local_508,uVar7);
          aom_noise_model_get_grain_parameters(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
          local_20a = 0;
          aom_film_grain_table_append
                    ((aom_film_grain_table_t *)
                     CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0),
                     (int64_t)in_stack_fffffffffffff3e8,(int64_t)in_stack_fffffffffffff3e0,
                     (aom_film_grain_t *)
                     CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
          aom_noise_model_save_latest(in_stack_fffffffffffff3d0);
          local_508 = uVar7;
        }
        if (local_4f0 != (FILE *)0x0) {
          print_debug_info(in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                           in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                           in_stack_fffffffffffff674,in_stack_fffffffffffff668);
        }
        fprintf(_stdout,"Done noise model update, status = %d\n",(ulong)bVar2);
      }
      local_50c = local_50c + 1;
    }
    die("Unable to read input denoised file");
  }
  die("Unable to open input_denoised: %s",local_40);
}

Assistant:

int main(int argc, char *argv[]) {
  noise_model_args_t args = { 0,  0, { 25, 1 }, 0, 0, 0,   AOM_IMG_FMT_I420,
                              32, 8, 1,         0, 1, NULL };
  aom_image_t raw, denoised;
  FILE *infile = NULL;
  AvxVideoInfo info;

  memset(&info, 0, sizeof(info));

  (void)argc;
  exec_name = argv[0];
  parse_args(&args, argv + 1);

  info.frame_width = args.width;
  info.frame_height = args.height;
  info.time_base.numerator = args.fps.den;
  info.time_base.denominator = args.fps.num;

  if (info.frame_width <= 0 || info.frame_height <= 0 ||
      (info.frame_width % 2) != 0 || (info.frame_height % 2) != 0) {
    die("Invalid frame size: %dx%d", info.frame_width, info.frame_height);
  }
  if (!aom_img_alloc(&raw, args.img_fmt, info.frame_width, info.frame_height,
                     1)) {
    die("Failed to allocate image.");
  }
  if (!aom_img_alloc(&denoised, args.img_fmt, info.frame_width,
                     info.frame_height, 1)) {
    die("Failed to allocate image.");
  }
  infile = fopen(args.input, "rb");
  if (!infile) {
    die("Failed to open input file: %s", args.input);
  }
  fprintf(stderr, "Bit depth: %d  stride:%d\n", args.bit_depth, raw.stride[0]);

  const int high_bd = args.bit_depth > 8;
  const int block_size = args.block_size;
  aom_flat_block_finder_t block_finder;
  aom_flat_block_finder_init(&block_finder, block_size, args.bit_depth,
                             high_bd);

  const int num_blocks_w = (info.frame_width + block_size - 1) / block_size;
  const int num_blocks_h = (info.frame_height + block_size - 1) / block_size;
  uint8_t *flat_blocks = (uint8_t *)aom_malloc(num_blocks_w * num_blocks_h);
  if (!flat_blocks) die("Failed to allocate block data.");
  // Sets the random seed on the first entry in the output table
  int16_t random_seed = 7391;
  aom_noise_model_t noise_model;
  aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3, args.bit_depth,
                                      high_bd };
  aom_noise_model_init(&noise_model, params);

  FILE *denoised_file = 0;
  if (args.input_denoised) {
    denoised_file = fopen(args.input_denoised, "rb");
    if (!denoised_file)
      die("Unable to open input_denoised: %s", args.input_denoised);
  } else {
    die("--input-denoised file must be specified");
  }
  FILE *debug_file = 0;
  if (args.debug_file) {
    debug_file = fopen(args.debug_file, "w");
  }
  aom_film_grain_table_t grain_table = { 0, 0 };

  int64_t prev_timestamp = 0;
  int frame_count = 0;
  while (aom_img_read(&raw, infile)) {
    if (args.input_denoised) {
      if (!aom_img_read(&denoised, denoised_file)) {
        die("Unable to read input denoised file");
      }
    }
    if (frame_count % args.skip_frames == 0) {
      int num_flat_blocks = num_blocks_w * num_blocks_h;
      memset(flat_blocks, 1, num_flat_blocks);
      if (args.run_flat_block_finder) {
        memset(flat_blocks, 0, num_flat_blocks);
        num_flat_blocks = aom_flat_block_finder_run(
            &block_finder, raw.planes[0], info.frame_width, info.frame_height,
            info.frame_width, flat_blocks);
        fprintf(stdout, "Num flat blocks %d\n", num_flat_blocks);
      }

      const uint8_t *planes[3] = { raw.planes[0], raw.planes[1],
                                   raw.planes[2] };
      uint8_t *denoised_planes[3] = { denoised.planes[0], denoised.planes[1],
                                      denoised.planes[2] };
      int strides[3] = { raw.stride[0] >> high_bd, raw.stride[1] >> high_bd,
                         raw.stride[2] >> high_bd };
      int chroma_sub[3] = { raw.x_chroma_shift, raw.y_chroma_shift, 0 };

      fprintf(stdout, "Updating noise model...\n");
      aom_noise_status_t status = aom_noise_model_update(
          &noise_model, (const uint8_t *const *)planes,
          (const uint8_t *const *)denoised_planes, info.frame_width,
          info.frame_height, strides, chroma_sub, flat_blocks, block_size);

      int64_t cur_timestamp =
          frame_count * 10000000ULL * args.fps.den / args.fps.num;
      if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
        fprintf(stdout,
                "Noise type is different, updating parameters for time "
                "[ %" PRId64 ", %" PRId64 ")\n",
                prev_timestamp, cur_timestamp);
        aom_film_grain_t grain;
        aom_noise_model_get_grain_parameters(&noise_model, &grain);
        grain.random_seed = random_seed;
        random_seed = 0;
        aom_film_grain_table_append(&grain_table, prev_timestamp, cur_timestamp,
                                    &grain);
        aom_noise_model_save_latest(&noise_model);
        prev_timestamp = cur_timestamp;
      }
      if (debug_file) {
        print_debug_info(debug_file, &raw, &denoised, flat_blocks, block_size,
                         &noise_model);
      }
      fprintf(stdout, "Done noise model update, status = %d\n", status);
    }
    frame_count++;
  }

  aom_film_grain_t grain;
  aom_noise_model_get_grain_parameters(&noise_model, &grain);
  grain.random_seed = random_seed;
  aom_film_grain_table_append(&grain_table, prev_timestamp, INT64_MAX, &grain);
  if (args.output_grain_table) {
    struct aom_internal_error_info error_info;
    if (AOM_CODEC_OK != aom_film_grain_table_write(&grain_table,
                                                   args.output_grain_table,
                                                   &error_info)) {
      die("Unable to write output film grain table");
    }
  }
  aom_film_grain_table_free(&grain_table);

  if (infile) fclose(infile);
  if (denoised_file) fclose(denoised_file);
  if (debug_file) fclose(debug_file);
  aom_img_free(&raw);
  aom_img_free(&denoised);

  return EXIT_SUCCESS;
}